

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O1

void * __thiscall cppjit::builder::builder::compile(builder *this)

{
  int iVar1;
  long *plVar2;
  undefined4 extraout_var;
  cppjit_exception *this_00;
  long *plVar3;
  ofstream kernel_file;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [14];
  ios_base local_128 [264];
  
  if (this->has_source_ != false) {
    local_220._0_8_ = local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,detail::DEFAULT_KERNEL_COMPILE_DIR,0x109535);
    make_compile_dir(this,(string *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != local_210) {
      operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
    }
    if (this->has_inline_source_ == true) {
      std::__cxx11::string::_M_assign((string *)&this->source_dir);
      std::operator+(&local_240,&this->source_dir,&this->kernel_name);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_240);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_250 = *plVar3;
        lStack_248 = plVar2[3];
        local_260 = &local_250;
      }
      else {
        local_250 = *plVar3;
        local_260 = (long *)*plVar2;
      }
      local_258 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::ofstream::ofstream(local_220,(string *)&local_260,_S_out);
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_220,(this->source)._M_dataplus._M_p,
                 (this->source)._M_string_length);
      std::ofstream::close();
      local_220._0_8_ = _VTT;
      *(undefined8 *)(local_220 + *(long *)(_VTT->_M_local_buf + -0x18)) = __filebuf;
      std::filebuf::~filebuf((filebuf *)(local_220 + 8));
      std::ios_base::~ios_base(local_128);
    }
    iVar1 = (**this->_vptr_builder)(this);
    return (void *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"source not set","");
  cppjit_exception::cppjit_exception(this_00,(string *)local_220);
  __cxa_throw(this_00,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void *compile() {
    if (!has_source_) {
      throw cppjit_exception("source not set");
    }
    // make sure it actually exists
    make_compile_dir();

    if (has_inline_source_) {
      source_dir = compile_dir;
      std::ofstream kernel_file(source_dir + kernel_name + ".cpp");
      kernel_file << source;
      kernel_file.close();
    }

    return compile_impl();
  }